

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O2

void secp256k1_pubkey_save(secp256k1_pubkey *pubkey,secp256k1_ge *ge)

{
  secp256k1_ge_storage s;
  secp256k1_fe y;
  secp256k1_fe x;
  secp256k1_fe_storage local_b8;
  secp256k1_fe_storage local_98;
  secp256k1_fe local_78;
  secp256k1_fe local_48;
  
  local_48.n[0] = (ge->x).n[0];
  local_48.n[1] = (ge->x).n[1];
  local_48.n[2] = (ge->x).n[2];
  local_48.n[3] = (ge->x).n[3];
  local_48.n[4] = (ge->x).n[4];
  secp256k1_fe_impl_normalize(&local_48);
  local_78.n[4] = (ge->y).n[4];
  local_78.n[0] = (ge->y).n[0];
  local_78.n[1] = (ge->y).n[1];
  local_78.n[2] = (ge->y).n[2];
  local_78.n[3] = (ge->y).n[3];
  secp256k1_fe_impl_normalize(&local_78);
  secp256k1_fe_impl_to_storage(&local_b8,&local_48);
  secp256k1_fe_impl_to_storage(&local_98,&local_78);
  *(uint64_t *)(pubkey->data + 0x30) = local_98.n[2];
  *(uint64_t *)(pubkey->data + 0x38) = local_98.n[3];
  *(uint64_t *)(pubkey->data + 0x20) = local_98.n[0];
  *(uint64_t *)(pubkey->data + 0x28) = local_98.n[1];
  *(uint64_t *)(pubkey->data + 0x10) = local_b8.n[2];
  *(uint64_t *)(pubkey->data + 0x18) = local_b8.n[3];
  *(uint64_t *)pubkey->data = local_b8.n[0];
  *(uint64_t *)(pubkey->data + 8) = local_b8.n[1];
  return;
}

Assistant:

static void secp256k1_pubkey_save(secp256k1_pubkey* pubkey, secp256k1_ge* ge) {
    secp256k1_ge_storage s;

    STATIC_ASSERT(sizeof(secp256k1_ge_storage) == 64);
    VERIFY_CHECK(!secp256k1_ge_is_infinity(ge));
    secp256k1_ge_to_storage(&s, ge);
    memcpy(&pubkey->data[0], &s, 64);
}